

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  UnitTestImpl *pUVar5;
  undefined8 extraout_RAX;
  TestRole TVar6;
  char *pcVar7;
  ostream *poVar8;
  allocator local_12d;
  int local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  sVar3 = GetThreadCount();
  if (sVar3 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_e0,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                       ,0x344);
    Message::Message((Message *)&local_128);
    poVar8 = (ostream *)(local_128._M_dataplus._M_p + 0x10);
    std::operator<<(poVar8,"Death tests use fork(), which is unsafe particularly");
    std::operator<<(poVar8," in a threaded context. For this test, ");
    std::operator<<((ostream *)(local_128._M_dataplus._M_p + 0x10),"Google Test");
    std::operator<<((ostream *)(local_128._M_dataplus._M_p + 0x10)," ");
    poVar8 = (ostream *)(local_128._M_dataplus._M_p + 0x10);
    if (sVar3 == 0) {
      pcVar7 = "couldn\'t detect the number of threads.";
    }
    else {
      std::operator<<(poVar8,"detected ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_128._M_dataplus._M_p + 0x10));
      poVar8 = (ostream *)(local_128._M_dataplus._M_p + 0x10);
      pcVar7 = " threads.";
    }
    std::operator<<(poVar8,pcVar7);
    StringStreamToString(&local_108,(stringstream *)local_128._M_dataplus._M_p);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_128);
    std::operator<<((ostream *)&std::cerr,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    GTestLog::~GTestLog((GTestLog *)&local_e0);
  }
  iVar1 = pipe(pipe_fd);
  if (iVar1 == -1) {
    std::__cxx11::string::string((string *)&local_a0,"CHECK failed: File ",(allocator *)&local_12c);
    std::operator+(&local_80,&local_a0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_60,&local_80,", line ");
    local_40._M_dataplus._M_p._0_4_ = 0x348;
    StreamableToString<int>(&local_c0,(int *)&local_40);
    std::operator+(&local_e0,&local_60,&local_c0);
    std::operator+(&local_128,&local_e0,": ");
    std::operator+(&local_108,&local_128,"pipe(pipe_fd) != -1");
    DeathTestAbort(&local_108);
  }
  else {
    std::__cxx11::string::string((string *)&local_108,"",(allocator *)&local_128);
    DeathTest::set_last_death_test_message(&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    CaptureStderr();
    FlushInfoLog();
    _Var2 = fork();
    if (_Var2 != -1) {
      *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = _Var2;
      if (_Var2 == 0) {
        TVar6 = EXECUTE_TEST;
        do {
          iVar1 = close(pipe_fd[0]);
          if (iVar1 != -1) goto LAB_0017039c;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string((string *)&local_c0,"CHECK failed: File ",&local_12d);
        std::operator+(&local_a0,&local_c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_80,&local_a0,", line ");
        local_12c = 0x359;
        StreamableToString<int>(&local_40,&local_12c);
        std::operator+(&local_60,&local_80,&local_40);
        std::operator+(&local_e0,&local_60,": ");
        std::operator+(&local_128,&local_e0,"close(pipe_fd[0])");
        std::operator+(&local_108,&local_128," != -1");
        DeathTestAbort(&local_108);
LAB_0017039c:
        (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pipe_fd[1];
        pUVar5 = GetUnitTestImpl();
        ((pUVar5->listeners_).repeater_)->forwarding_enabled_ = false;
        g_in_fast_death_test_child = 1;
      }
      else {
        do {
          iVar1 = close(pipe_fd[1]);
          if (iVar1 != -1) goto LAB_0017029c;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        std::__cxx11::string::string((string *)&local_c0,"CHECK failed: File ",&local_12d);
        std::operator+(&local_a0,&local_c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                      );
        std::operator+(&local_80,&local_a0,", line ");
        local_12c = 0x365;
        StreamableToString<int>(&local_40,&local_12c);
        std::operator+(&local_60,&local_80,&local_40);
        std::operator+(&local_e0,&local_60,": ");
        std::operator+(&local_128,&local_e0,"close(pipe_fd[1])");
        std::operator+(&local_108,&local_128," != -1");
        DeathTestAbort(&local_108);
LAB_0017029c:
        (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
        (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
        TVar6 = OVERSEE_TEST;
      }
      return TVar6;
    }
  }
  std::__cxx11::string::string((string *)&local_a0,"CHECK failed: File ",(allocator *)&local_12c);
  std::operator+(&local_80,&local_a0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_60,&local_80,", line ");
  local_40._M_dataplus._M_p._0_4_ = 0x356;
  StreamableToString<int>(&local_c0,(int *)&local_40);
  std::operator+(&local_e0,&local_60,&local_c0);
  std::operator+(&local_128,&local_e0,": ");
  std::operator+(&local_108,&local_128,"child_pid != -1");
  DeathTestAbort(&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding();
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}